

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_list.cpp
# Opt level: O2

void __thiscall ExprEval::Engine::NodeList::print(NodeList *this)

{
  int iVar1;
  pointer pNVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  allocator local_51;
  string type;
  
  lVar6 = 0;
  uVar5 = 0;
  do {
    pNVar2 = (this->m_nodes).
             super__Vector_base<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->m_nodes).
                       super__Vector_base<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2) / 0x50) <= uVar5)
    {
      return;
    }
    std::__cxx11::string::string((string *)&type,"expr",&local_51);
    iVar1 = *(int *)((long)&pNVar2->type + lVar6);
    if ((iVar1 == 1) || (iVar1 == 0)) {
      std::__cxx11::string::assign((char *)&type);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"[");
    poVar3 = std::operator<<(poVar3,(string *)&type);
    poVar3 = std::operator<<(poVar3,"]");
    std::operator<<(poVar3,"{");
    iVar1 = *(int *)((long)&pNVar2->type + lVar6);
    lVar4 = 0x10;
    if (iVar1 == 1) {
LAB_0010fe86:
      std::operator<<((ostream *)&std::cout,(string *)((long)&pNVar2->type + lVar4 + lVar6));
    }
    else {
      if (iVar1 != 0) {
        lVar4 = 0x30;
        goto LAB_0010fe86;
      }
      std::ostream::_M_insert<double>(*(double *)((long)&pNVar2->number + lVar6));
    }
    std::operator<<((ostream *)&std::cout,"} --> ");
    std::__cxx11::string::~string((string *)&type);
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x50;
  } while( true );
}

Assistant:

void NodeList::print() const{
            for(size_t i=0; i<m_nodes.size(); ++i){
                const Node* node = &(m_nodes[i]);
                std::string type = "expr";
                if(node->type == NodeType::Number){
                    type = "num";
                } else if(node->type == NodeType::Operator){
                    type = "opr";
                }
                std::cout<<"["<<type<<"]"<<"{";
                if(node->type == NodeType::Number){
                    std::cout<<node->number;
                } else if(node->type == NodeType::Operator){
                    std::cout<<node->symbol;
                } else{
                    std::cout<<node->expression;
                }
                std::cout<<"} --> ";
            }
        }